

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O2

void communicate(int connection,Arguments *args,int busy_waiting)

{
  int iVar1;
  void *buffer;
  ssize_t sVar2;
  
  buffer = malloc((long)args->size);
  iVar1 = args->count;
  while( true ) {
    if (iVar1 < 1) {
      cleanup((EVP_PKEY_CTX *)(ulong)(uint)connection);
      return;
    }
    iVar1 = receive(connection,buffer,args->size,busy_waiting);
    if (iVar1 == -1) break;
    iVar1 = args->size;
    memset(buffer,0x2a,(long)iVar1);
    sVar2 = send(connection,buffer,(long)iVar1,0);
    if (sVar2 == -1) {
      throw("Error sending on client-side");
    }
    iVar1 = args->count + -1;
    args->count = iVar1;
  }
  throw("Error receiving on client-side");
}

Assistant:

void communicate(int connection, struct Arguments* args, int busy_waiting) {
	void* buffer = malloc(args->size);

	for (; args->count > 0; --args->count) {
		if (receive(connection, buffer, args->size, busy_waiting) == -1) {
			throw("Error receiving on client-side");
		}

		// Dummy operation
		memset(buffer, '*', args->size);

		if (send(connection, buffer, args->size, 0) == -1) {
			throw("Error sending on client-side");
		}
	}

	cleanup(connection, buffer);
}